

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

bool bloaty::wasm::ReadMagic(string_view *data)

{
  uint uVar1;
  uint version;
  uint magic;
  uint32_t wasm_magic;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar1 = ReadFixed<unsigned_int,4ul>
                    ((string_view *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (uVar1 == 0x6d736100) {
    ReadFixed<unsigned_int,4ul>
              ((string_view *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  return uVar1 == 0x6d736100;
}

Assistant:

bool ReadMagic(string_view* data) {
  const uint32_t wasm_magic = 0x6d736100;
  auto magic = ReadFixed<uint32_t>(data);

  if (magic != wasm_magic) {
    return false;
  }

  // TODO(haberman): do we need to fail if this is >1?
  auto version = ReadFixed<uint32_t>(data);
  (void)version;

  return true;
}